

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

bool __thiscall
cmUuid::StringToBinary
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  int iVar1;
  pointer puVar2;
  bool bVar3;
  int *piVar4;
  ulong uVar5;
  string *this_00;
  long lVar6;
  long lVar7;
  string local_50;
  
  puVar2 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(output,0x10);
  if (input->_M_string_length == 0x24) {
    piVar4 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = true;
    if ((this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish != piVar4) {
      lVar7 = 0;
      lVar6 = 0;
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          if ((input->_M_dataplus)._M_p[lVar6] != '-') goto LAB_004e8fda;
          lVar6 = lVar6 + 1;
          piVar4 = (int *)((long)piVar4 + lVar7);
        }
        iVar1 = *piVar4;
        this_00 = &local_50;
        std::__cxx11::string::substr((ulong)this_00,(ulong)input);
        bVar3 = StringToBinaryImpl((cmUuid *)this_00,&local_50,output);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_004e8fda;
        lVar6 = lVar6 + (long)iVar1 * 2;
        uVar5 = uVar5 + 1;
        piVar4 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 4;
      } while (uVar5 < (ulong)((long)(this->Groups).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2))
      ;
      bVar3 = true;
    }
  }
  else {
LAB_004e8fda:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmUuid::StringToBinary(std::string const& input,
                            std::vector<unsigned char>& output) const
{
  output.clear();
  output.reserve(16);

  if (input.length() != 36) {
    return false;
  }
  size_t index = 0;
  for (size_t i = 0; i < this->Groups.size(); ++i) {
    if (i != 0 && input[index++] != '-') {
      return false;
    }
    size_t digits = this->Groups[i] * 2;
    if (!StringToBinaryImpl(input.substr(index, digits), output)) {
      return false;
    }

    index += digits;
  }

  return true;
}